

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

xmlParserInputPtr xmlNewInputFromString(char *url,char *str,int flags)

{
  xmlParserInputBufferPtr buf;
  xmlParserInputPtr pxVar1;
  
  if (str != (char *)0x0) {
    buf = xmlNewInputBufferString(str,flags);
    if (buf != (xmlParserInputBufferPtr)0x0) {
      pxVar1 = xmlNewInputInternal(buf,url);
      return pxVar1;
    }
  }
  return (xmlParserInputPtr)0x0;
}

Assistant:

xmlParserInputPtr
xmlNewInputFromString(const char *url, const char *str, int flags) {
    xmlParserInputBufferPtr buf;

    if (str == NULL)
	return(NULL);

    buf = xmlNewInputBufferString(str, flags);
    if (buf == NULL)
        return(NULL);

    return(xmlNewInputInternal(buf, url));
}